

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x877218;
  *(undefined8 *)&this->field_0x30 = 0x877330;
  *(undefined8 *)&this[-1].field_0xd0 = 0x877240;
  *(undefined8 *)&this[-1].field_0xe0 = 0x877268;
  *(undefined8 *)&this[-1].field_0x118 = 0x877290;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8772b8;
  *(undefined8 *)&this[-1].field_0x180 = 0x8772e0;
  *(undefined8 *)this = 0x877308;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__00877350);
  operator_delete(&this[-1].field_0x48,400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}